

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_freeproto(lua_State *L,Proto *f)

{
  Proto *f_local;
  lua_State *L_local;
  
  raviV_freeproto(L,f);
  luaM_realloc_(L,f->code,(long)f->sizecode << 2,0);
  luaM_realloc_(L,f->p,(long)f->sizep << 3,0);
  luaM_realloc_(L,f->k,(long)f->sizek << 4,0);
  luaM_realloc_(L,f->lineinfo,(long)f->sizelineinfo << 2,0);
  luaM_realloc_(L,f->locvars,(long)f->sizelocvars << 5,0);
  luaM_realloc_(L,f->upvalues,(long)f->sizeupvalues * 0x18,0);
  luaM_realloc_(L,f,0x90,0);
  return;
}

Assistant:

void luaF_freeproto (lua_State *L, Proto *f) {
  raviV_freeproto(L, f);
  luaM_freearray(L, f->code, f->sizecode);
  luaM_freearray(L, f->p, f->sizep);
  luaM_freearray(L, f->k, f->sizek);
  luaM_freearray(L, f->lineinfo, f->sizelineinfo);
  luaM_freearray(L, f->locvars, f->sizelocvars);
  luaM_freearray(L, f->upvalues, f->sizeupvalues);
  luaM_free(L, f);
}